

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

void Aig_ManDfs_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  void **ppvVar3;
  
  if (pObj != (Aig_Obj_t *)0x0) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                    ,0x7b,"void Aig_ManDfs_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if (pObj->TravId != p->nTravIds) {
      pObj->TravId = p->nTravIds;
      if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
         (pObj_00 = p->pEquivs[pObj->Id], pObj_00 != (Aig_Obj_t *)0x0)) {
        Aig_ManDfs_rec(p,pObj_00,vNodes);
      }
      Aig_ManDfs_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
      Aig_ManDfs_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
      uVar1 = vNodes->nSize;
      if (uVar1 == vNodes->nCap) {
        if ((int)uVar1 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar3 = vNodes->pArray;
      }
      iVar2 = vNodes->nSize;
      vNodes->nSize = iVar2 + 1;
      ppvVar3[iVar2] = pObj;
    }
  }
  return;
}

Assistant:

void Aig_ManDfs_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( pObj == NULL )
        return;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( p->pEquivs && Aig_ObjEquiv(p, pObj) )
        Aig_ManDfs_rec( p, Aig_ObjEquiv(p, pObj), vNodes );
    Aig_ManDfs_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManDfs_rec( p, Aig_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}